

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bfba::ktxTexture1WriteKTX2TestBase<unsigned_char,_3U,_32849U>::runTest
          (ktxTexture1WriteKTX2TestBase<unsigned_char,_3U,_32849U> *this,bool writeOrientationMeta,
          bool writeWriterMeta)

{
  ktx_uint8_t *pkVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  uint *__s2;
  ulong uVar9;
  undefined7 in_register_00000011;
  KTX_header2 *pKVar10;
  pointer *__ptr;
  undefined7 in_register_00000031;
  KTX_header2 *levelIndex;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var11;
  char *in_R9;
  ktxHashList *ppkVar12;
  int *piVar13;
  ostream *poVar14;
  ktx_uint64_t levelOffset;
  ktx_uint64_t prevOffset;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxHashListEntry *pWriter;
  ktxHashList *hl;
  ktx_uint8_t *ktxMemFile;
  ktxTexture1 *texture;
  ktx_uint32_t kvDataLen;
  ktx_uint8_t *kvData;
  ktx_size_t ktxMemFileLen;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  AssertHelper local_90;
  ktx_error_code_e local_84;
  AssertHelper local_80;
  undefined8 local_78;
  KTX_header2 *local_70;
  ktxTexture1 *local_68;
  TextureWriterTestHelper<unsigned_char,_3U,_32849U> *local_60;
  uint local_54;
  AssertHelper local_50;
  KTX_header2 *local_48;
  void *local_40;
  undefined1 local_38 [8];
  
  local_68 = (ktxTexture1 *)0x0;
  ktxHashList_Create(&local_78,CONCAT71(in_register_00000031,writeOrientationMeta),
                     CONCAT71(in_register_00000011,writeWriterMeta));
  local_84 = ktxTexture1_Create(&(this->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).
                                 helper.createInfo,1,&local_68);
  local_c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_c0._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_b0,"result","KTX_SUCCESS",&local_84,(ktx_error_code_e *)&local_c0);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x714,pcVar7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_c0._M_head_impl._0_1_ = local_68 != (ktxTexture1 *)0x0;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68 == (ktxTexture1 *)0x0) {
    testing::Message::Message((Message *)&local_80);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_80.data_)->line,"ktxTexture1_Create failed: ",0x1b);
    pcVar7 = (char *)ktxErrorString(local_84);
    piVar13 = &(local_80.data_)->line;
    if (pcVar7 == (char *)0x0) {
      sVar6 = 6;
      pcVar7 = "(null)";
    }
    else {
      sVar6 = strlen(pcVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar13,pcVar7,sVar6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)&local_c0,(AssertionResult *)0x17796e,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x715,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    _Var11._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80.data_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
      _Var11._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80.data_
      ;
    }
LAB_00132158:
    if ((AssertHelperData *)_Var11._M_head_impl != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)_Var11._M_head_impl + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
    return;
  }
  if (writeOrientationMeta) {
    ppkVar12 = &local_68->kvDataHead;
    pcVar7 = (this->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper.
             super_WriterTestHelper<unsigned_char,_3U,_32849U>.orientation;
    sVar6 = strlen(pcVar7);
    ktxHashList_AddKVPair(ppkVar12,"KTXorientation",(int)sVar6 + 1,pcVar7);
    uVar2 = local_78;
    pcVar7 = (this->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper.
             super_WriterTestHelper<unsigned_char,_3U,_32849U>.orientation_ktx2;
    sVar6 = strlen(pcVar7);
    ktxHashList_AddKVPair(uVar2,"KTXorientation",(int)sVar6 + 1,pcVar7);
  }
  ktxHashList_AddKVPair
            (&local_68->kvDataHead,"KTXwriter",
             (int)(this->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper.
                  super_WriterTestHelper<unsigned_char,_3U,_32849U>.writer_ktx2._M_string_length,
             (this->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper.
             super_WriterTestHelper<unsigned_char,_3U,_32849U>.writer_ktx2._M_dataplus._M_p);
  ktxHashList_AddKVPair
            (local_78,"KTXwriter",
             (int)(this->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper.
                  super_WriterTestHelper<unsigned_char,_3U,_32849U>.writer_ktx2._M_string_length,
             (this->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper.
             super_WriterTestHelper<unsigned_char,_3U,_32849U>.writer_ktx2._M_dataplus._M_p);
  local_80.data_ = (AssertHelperData *)0x0;
  ktxHashList_FindEntry(local_78,"KTXwriter",&local_80);
  local_84 = appendLibId(local_78,local_80.data_);
  local_c0._M_head_impl = local_c0._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_b0,"result","KTX_SUCCESS",&local_84,(ktx_error_code_e *)&local_c0);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x731,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  local_60 = &(this->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper;
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  ktxHashList_Sort(local_78);
  ktxHashList_Serialize(local_78,&local_54,&local_40);
  local_84 = TextureWriterTestHelper<unsigned_char,_3U,_32849U>::copyImagesToTexture
                       (local_60,local_68);
  local_c0._M_head_impl = local_c0._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_b0,"result","KTX_SUCCESS",&local_84,(ktx_error_code_e *)&local_c0);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x737,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  bVar3 = TextureWriterTestHelper<unsigned_char,_3U,_32849U>::compareTexture1Images
                    (local_60,local_68->pData);
  local_c0._M_head_impl._0_1_ = bVar3;
  local_c8._M_head_impl._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_b0,"helper.compareTexture1Images(texture->pData)","true",
             (bool *)&local_c0,(bool *)&local_c8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x739,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_84 = ktxTexture1_WriteKTX2ToMemory(local_68,&local_70,local_38);
  pKVar10 = local_70;
  _Var11._M_head_impl = local_c0._M_head_impl;
  local_c0._M_head_impl._0_1_ = local_84 == KTX_SUCCESS;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_84 != KTX_SUCCESS) {
    testing::Message::Message((Message *)&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_c8._M_head_impl + 0x10),"ktxTexture_WriteKTX2ToMemory failed: ",
               0x25);
    pcVar7 = (char *)ktxErrorString(local_84);
    poVar14 = (ostream *)(local_c8._M_head_impl + 0x10);
    if (pcVar7 == (char *)0x0) {
      sVar6 = 6;
      pcVar7 = "(null)";
    }
    else {
      sVar6 = strlen(pcVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar7,sVar6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)&local_c0,(AssertionResult *)"result == KTX_SUCCESS",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x73f,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    _Var11._M_head_impl = local_c8._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
      _Var11._M_head_impl = local_c8._M_head_impl;
    }
    goto LAB_00132158;
  }
  uVar9 = 0xab4b5458203230bb;
  uVar8 = *(ulong *)local_70->identifier;
  uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
          (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
          (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  if (uVar8 == 0xab4b5458203230bb) {
    uVar4 = *(uint *)(local_70->identifier + 8);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar8 = (ulong)uVar4;
    local_c0._M_head_impl._0_4_ = 0;
    if (uVar4 == 0xd0a1a0a) goto LAB_00132072;
    uVar9 = 0xd0a1a0a;
  }
  local_c0._M_head_impl._0_4_ = -(uint)(uVar8 < uVar9) | 1;
LAB_00132072:
  local_c0._M_head_impl._4_4_ = SUB84(_Var11._M_head_impl,4);
  local_c8._M_head_impl = local_c8._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b0,"memcmp(header, ktxId2, sizeof(ktxId2))","0",(int *)&local_c0,
             (int *)&local_c8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x744,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  bVar3 = WriterTestHelper<unsigned_char,_3U,_32849U>::texinfo::compare
                    (&(this->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper.
                      super_WriterTestHelper<unsigned_char,_3U,_32849U>.texinfo,pKVar10);
  local_c0._M_head_impl._0_1_ = bVar3;
  local_c8._M_head_impl._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_b0,"helper.texinfo.compare(header)","true",(bool *)&local_c0,
             (bool *)&local_c8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x745,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  __s2 = (uint *)vk2dfd(pKVar10->vkFormat);
  iVar5 = memcmp(local_70->identifier + (pKVar10->dataFormatDescriptor).byteOffset,__s2,(ulong)*__s2
                );
  local_c0._M_head_impl._0_4_ = iVar5;
  local_c8._M_head_impl = local_c8._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b0,
             "memcmp(ktxMemFile + header->dataFormatDescriptor.byteOffset, dfd, *dfd)","0",
             (int *)&local_c0,(int *)&local_c8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x74f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  uVar4 = (pKVar10->keyValueData).byteOffset;
  pkVar1 = local_70->identifier;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_b0,"header->keyValueData.byteLength","kvDataLen",
             &(pKVar10->keyValueData).byteLength,&local_54);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x753,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  iVar5 = memcmp(pkVar1 + uVar4,local_40,(ulong)local_54);
  local_c0._M_head_impl._0_4_ = iVar5;
  local_c8._M_head_impl = local_c8._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b0,"memcmp(filePtr, kvData, kvDataLen)","0",(int *)&local_c0,
             (int *)&local_c8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x754,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  pKVar10 = local_70 + 1;
  local_c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
  ;
  levelIndex = pKVar10;
  if ((local_60->super_WriterTestHelper<unsigned_char,_3U,_32849U>).numLevels != 0) {
    uVar8 = 0;
    local_48 = pKVar10;
    do {
      local_c8._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            pKVar10->identifier;
      local_90.data_ =
           (AssertHelperData *)((ulong)local_c8._M_head_impl % (ulong)this->requiredLevelAlignment);
      local_50.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_b0,"levelOffset % requiredLevelAlignment","0U",
                 (unsigned_long *)&local_90,(uint *)&local_50);
      if (local_b0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        pcVar7 = "";
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = (local_a8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x76e,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_90.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
      testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                ((internal *)local_b0,"levelOffset","prevOffset",(unsigned_long *)&local_c8,
                 (unsigned_long *)&local_c0);
      if (local_b0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        pcVar7 = "";
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = (local_a8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x771,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_90.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
      local_c0._M_head_impl = local_c8._M_head_impl;
      uVar8 = uVar8 + 1;
      pKVar10 = (KTX_header2 *)&pKVar10->pixelHeight;
      levelIndex = local_48;
    } while (uVar8 < (local_60->super_WriterTestHelper<unsigned_char,_3U,_32849U>).numLevels);
  }
  bVar3 = WriterTestHelper<unsigned_char,_3U,_32849U>::compareRawImages
                    (&local_60->super_WriterTestHelper<unsigned_char,_3U,_32849U>,
                     (ktxLevelIndexEntry *)levelIndex,local_70->identifier);
  local_c8._M_head_impl._0_1_ = bVar3;
  local_90.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_b0,"helper.compareRawImages(levelIndex, ktxMemFile)","true",
             (bool *)&local_c8,(bool *)&local_90);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x775,pcVar7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  operator_delete(local_70,1);
  (*local_68->vtbl->Destroy)((ktxTexture *)local_68);
  return;
}

Assistant:

void runTest(bool writeOrientationMeta, bool writeWriterMeta = true) {
        ktxTexture1* texture = 0;
        KTX_error_code result;
        ktx_uint8_t* ktxMemFile;
        ktx_size_t ktxMemFileLen;
        ktx_uint8_t* filePtr;
        ktxHashList* hl;
        ktxHashList_Create(&hl);
        ktx_uint8_t* kvData;
        ktx_uint32_t kvDataLen;

        result = ktxTexture1_Create(&helper.createInfo,
                                   KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                   &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                     << ktxErrorString(result);

        if (writeOrientationMeta) {
            // Reminder: this is for the KTX 1 texture we have just created.
            ktxHashList_AddKVPair(&texture->kvDataHead, KTX_ORIENTATION_KEY,
                                  (unsigned int)strlen(helper.orientation) + 1,
                                  helper.orientation);
            // This is for the comparison metadata.
            ktxHashList_AddKVPair(hl, KTX_ORIENTATION_KEY,
                                  (unsigned int)strlen(helper.orientation_ktx2) + 1,
                                  helper.orientation_ktx2);
        }
        // N.B. Writer metadata is not legal in a KTX v1 file but we know
        // we're going to write this out as a v2 file so okay.
        if (writeWriterMeta) {
            ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
                                  (uint32_t)helper.writer_ktx2.size(),
                                  helper.writer_ktx2.data());
            ktxHashList_AddKVPair(hl, KTX_WRITER_KEY,
                                  (uint32_t)helper.writer_ktx2.size(),
                                  helper.writer_ktx2.data());
        }
        // Now update the comparison metadata by doing the things WriteKTX2 is
        // supposed to do so we can check it's actually doing it..
        ktxHashListEntry* pWriter = nullptr;;
        ktxHashList_FindEntry(hl, KTX_WRITER_KEY, &pWriter);
        result = appendLibId(hl, pWriter);
        EXPECT_EQ(result, KTX_SUCCESS);
        ktxHashList_Sort(hl);
        // And retrieve the comparison metadata.
        ktxHashList_Serialize(hl, &kvDataLen, &kvData);

        result = helper.copyImagesToTexture(texture);
        EXPECT_EQ(result, KTX_SUCCESS);

        EXPECT_EQ(helper.compareTexture1Images(texture->pData), true);

        result = ktxTexture1_WriteKTX2ToMemory(texture,
                                               &ktxMemFile,
                                               &ktxMemFileLen);

        ASSERT_TRUE(result == KTX_SUCCESS) << "ktxTexture_WriteKTX2ToMemory failed: "
                                           << ktxErrorString(result);

        KTX_header2* header = (KTX_header2*)ktxMemFile;

        EXPECT_EQ(memcmp(header, ktxId2, sizeof(ktxId2)), 0);
        EXPECT_EQ(helper.texinfo.compare(header), true);

        // Check the format descriptor.
        // This uses the same code to generate the comparator DFD as the
        // code under test. However we have separate tests for the
        // generator, so can be reasonably confident in it. This test
        // ensures there is a DFD in the file.
        ktx_uint32_t* dfd = vk2dfd(static_cast<VkFormat>(header->vkFormat));
        EXPECT_EQ(memcmp(ktxMemFile + header->dataFormatDescriptor.byteOffset,
                         dfd,
                         *dfd), 0);

        // Check the metadata.
        filePtr = ktxMemFile + header->keyValueData.byteOffset;
        EXPECT_EQ(header->keyValueData.byteLength, kvDataLen);
        EXPECT_EQ(memcmp(filePtr, kvData, kvDataLen), 0);
        filePtr += kvDataLen;

#if 0
        if (writeOrientationMeta) {
            EXPECT_EQ(header->keyValueData.byteLength,
                      helper.kvDataLenAll_ktx2);
            EXPECT_EQ(memcmp(filePtr, helper.kvDataAll_ktx2,
                             helper.kvDataLenAll_ktx2), 0);
            filePtr += helper.kvDataLenAll_ktx2;
        } else {
            EXPECT_EQ(header->keyValueData.byteLength,
                      helper.kvDataLenWriter_ktx2);
            EXPECT_EQ(memcmp(filePtr, helper.kvDataWriter_ktx2,
                             helper.kvDataLenWriter_ktx2), 0);
            filePtr += helper.kvDataLenWriter_ktx2;
        }
#endif
        // Offset of level 0 is first item in leveIndex after header.
        ktxLevelIndexEntry* levelIndex =
            reinterpret_cast<ktxLevelIndexEntry*>(ktxMemFile + sizeof(*header));

        ktx_uint64_t prevOffset = UINT64_MAX;
        for (ktx_uint32_t level = 0; level < helper.numLevels; level++) {
            ktx_uint64_t levelOffset = levelIndex[level].byteOffset;
            // Check offset is properly aligned.
            EXPECT_EQ(levelOffset % requiredLevelAlignment, 0U);
            // Check mipmaps are in order of increasing size in the file
            // therefore each offset should be smaller than the previous.
            EXPECT_LE(levelOffset, prevOffset);
            prevOffset = levelOffset;
        }

        EXPECT_EQ(helper.compareRawImages(levelIndex, ktxMemFile), true);
        delete ktxMemFile;
        ktxTexture_Destroy(ktxTexture(texture));
    }